

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Runner.h
# Opt level: O3

Value * __thiscall flow::Runner::Stack::operator[](Stack *this,int relativeIndex)

{
  pointer puVar1;
  long lVar2;
  Value *pVVar3;
  unsigned_long *puVar4;
  void *__src;
  long lVar5;
  undefined4 in_register_00000034;
  
  pVVar3 = (Value *)CONCAT44(in_register_00000034,relativeIndex);
  if (relativeIndex < 0) {
    puVar1 = (this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar5 = (long)(this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
    this = (Stack *)(lVar5 >> 3);
    if (this <= (new_allocator<unsigned_long> *)(ulong)(uint)~relativeIndex) goto LAB_0016982f;
    pVVar3 = (Value *)((long)puVar1 + (long)relativeIndex * 8 + lVar5);
  }
  else {
    puVar1 = (this->stack_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->stack_).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar1 >> 3) <=
        (ulong)(uint)relativeIndex) {
      operator[]();
LAB_0016982f:
      operator[]();
      puVar1 = *(pointer *)((long)this + 8);
      if (puVar1 != *(pointer *)this) {
        pVVar3 = (Value *)puVar1[-1];
        *(pointer *)((long)this + 8) = puVar1 + -1;
        return pVVar3;
      }
      pop();
      if ((ulong)pVVar3 >> 0x3c == 0) {
        lVar5 = *(long *)this;
        puVar4 = (unsigned_long *)(*(long *)((long)this + 0x10) - lVar5 >> 3);
        if (puVar4 < pVVar3) {
          lVar2 = *(long *)((long)this + 8);
          puVar4 = __gnu_cxx::new_allocator<unsigned_long>::allocate
                             ((new_allocator<unsigned_long> *)this,(size_type)pVVar3,(void *)0x0);
          __src = *(void **)this;
          if (0 < *(long *)((long)this + 8) - (long)__src) {
            memmove(puVar4,__src,*(long *)((long)this + 8) - (long)__src);
            __src = *(void **)this;
          }
          if (__src != (void *)0x0) {
            operator_delete(__src,*(long *)((long)this + 0x10) - (long)__src);
          }
          *(unsigned_long **)this = puVar4;
          *(long *)((long)this + 8) = (lVar2 - lVar5) + (long)puVar4;
          puVar4 = puVar4 + (long)pVVar3;
          *(unsigned_long **)((long)this + 0x10) = puVar4;
        }
        return puVar4;
      }
      std::__throw_length_error("vector::reserve");
    }
    pVVar3 = puVar1 + (uint)relativeIndex;
  }
  return pVVar3;
}

Assistant:

Value& operator[](int relativeIndex) {
      if (relativeIndex < 0) {
        FLOW_ASSERT(static_cast<size_t>(-relativeIndex - 1) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[stack_.size() + relativeIndex];
      } else {
        FLOW_ASSERT(static_cast<size_t>(relativeIndex) < stack_.size(),
                    "vm: Attempt to load from stack beyond stack top");
        return stack_[relativeIndex];
      }
    }